

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

X11FakeAuth *
ssh2_add_sharing_x11_display
          (ConnectionLayer *cl,int authtype,ssh_sharing_connstate *share_cs,
          share_channel *share_chan)

{
  X11FakeAuth *pXVar1;
  
  pXVar1 = x11_invent_fake_auth((tree234 *)cl[-7].logctx,authtype);
  pXVar1->share_cs = share_cs;
  pXVar1->share_chan = share_chan;
  return pXVar1;
}

Assistant:

static struct X11FakeAuth *ssh2_add_sharing_x11_display(
    ConnectionLayer *cl, int authtype, ssh_sharing_connstate *share_cs,
    share_channel *share_chan)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct X11FakeAuth *auth;

    /*
     * Make up a new set of fake X11 auth data, and add it to the tree
     * of currently valid ones with an indication of the sharing
     * context that it's relevant to.
     */
    auth = x11_invent_fake_auth(s->x11authtree, authtype);
    auth->share_cs = share_cs;
    auth->share_chan = share_chan;

    return auth;
}